

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O3

_Bool ascon_hasha_xof_matches
                (uint8_t *expected_digest,uint8_t *data,size_t expected_digest_len,size_t data_len)

{
  _Bool _Var1;
  ascon_hash_ctx_t ctx;
  ascon_bufstate_t local_58;
  
  local_58.sponge.x0 = 0x44906568b77b9832;
  local_58.sponge.x1 = 0xcd8d6cae53455532;
  local_58.sponge.x2 = 0xf7b5212756422129;
  local_58.sponge.x3 = 0x246885e1de0d225b;
  local_58.sponge.x4 = 0xa8cb5ce33449973f;
  local_58.buffer_len = '\0';
  local_58.flow_state = '\v';
  buffered_accumulation(&local_58,(uint8_t *)0x0,data,absorb_hasha_data,data_len,'\b');
  local_58.flow_state = '\f';
  _Var1 = hash_final_matches(ascon_permutation_8,&local_58,expected_digest,expected_digest_len);
  return _Var1;
}

Assistant:

ASCON_API bool
ascon_hasha_xof_matches(const uint8_t* const expected_digest,
                        const uint8_t* const data,
                        const size_t expected_digest_len,
                        const size_t data_len)
{
    ASCON_ASSERT(expected_digest_len == 0 || expected_digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_xof_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    return ascon_hasha_xof_final_matches(&ctx, expected_digest, expected_digest_len);
}